

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void P_SerializeSounds(FSerializer *arc)

{
  bool bVar1;
  int iVar2;
  FSerializer *this;
  char *musicname;
  byte local_19;
  char *pcStack_18;
  BYTE order;
  char *name;
  FSerializer *arc_local;
  
  name = (char *)arc;
  S_SerializeSounds(arc);
  DSeqNode::SerializeSequences((FSerializer *)name);
  pcStack_18 = (char *)0x0;
  bVar1 = FSerializer::isWriting((FSerializer *)name);
  if (bVar1) {
    iVar2 = S_GetMusic(&stack0xffffffffffffffe8);
    local_19 = (byte)iVar2;
  }
  this = FSerializer::StringPtr((FSerializer *)name,"musicname",&stack0xffffffffffffffe8);
  FSerializer::operator()(this,"musicorder",&local_19);
  bVar1 = FSerializer::isReading((FSerializer *)name);
  if (((bVar1) && (bVar1 = S_ChangeMusic(pcStack_18,(uint)local_19,true,false), !bVar1)) &&
     ((level.cdtrack == 0 || (bVar1 = S_ChangeCDMusic(level.cdtrack,level.cdid,true), !bVar1)))) {
    musicname = FString::operator_cast_to_char_(&level.Music);
    S_ChangeMusic(musicname,level.musicorder,true,false);
  }
  return;
}

Assistant:

void P_SerializeSounds(FSerializer &arc)
{
	S_SerializeSounds(arc);
	DSeqNode::SerializeSequences (arc);
	const char *name = NULL;
	BYTE order;

	if (arc.isWriting())
	{
		order = S_GetMusic(&name);
	}
	arc.StringPtr("musicname", name)
		("musicorder", order);

	if (arc.isReading())
	{
		if (!S_ChangeMusic(name, order))
			if (level.cdtrack == 0 || !S_ChangeCDMusic(level.cdtrack, level.cdid))
				S_ChangeMusic(level.Music, level.musicorder);
	}
}